

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

Vec_Int_t * Llb_Nonlin4CreateVars2Q(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,int fBackward)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  long lVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar15;
  
  pVVar5 = (Vec_Int_t *)calloc(1,0x10);
  uVar4 = Cudd_ReadSize(dd);
  if ((int)uVar4 < 1) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((ulong)uVar4 * 4);
    pVVar5->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = uVar4;
    auVar3 = _DAT_0094e250;
    lVar11 = (ulong)uVar4 - 1;
    auVar12._8_4_ = (int)lVar11;
    auVar12._0_8_ = lVar11;
    auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar11 = 0;
    auVar12 = auVar12 ^ _DAT_0094e250;
    auVar14 = _DAT_0094f530;
    auVar16 = _DAT_0094e240;
    do {
      auVar17 = auVar16 ^ auVar3;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar17._4_4_ == iVar13 && auVar12._0_4_ < auVar17._0_4_ ||
                  iVar13 < auVar17._4_4_) & 1)) {
        *(undefined4 *)((long)piVar6 + lVar11) = 1;
      }
      if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
          auVar17._12_4_ <= auVar12._12_4_) {
        *(undefined4 *)((long)piVar6 + lVar11 + 4) = 1;
      }
      auVar17 = auVar14 ^ auVar3;
      iVar8 = auVar17._4_4_;
      if (iVar8 <= iVar13 && (iVar8 != iVar13 || auVar17._0_4_ <= auVar12._0_4_)) {
        *(undefined4 *)((long)piVar6 + lVar11 + 8) = 1;
        *(undefined4 *)((long)piVar6 + lVar11 + 0xc) = 1;
      }
      lVar15 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar15 + 4;
      lVar15 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar15 + 4;
      lVar11 = lVar11 + 0x10;
    } while ((ulong)(uVar4 + 3 >> 2) << 4 != lVar11);
  }
  pVVar5->nSize = uVar4;
  iVar13 = pAig->nRegs;
  if (0 < iVar13) {
    pVVar2 = pAig->vCos;
    uVar7 = (ulong)(uint)pAig->nTruePos;
    iVar8 = 0;
    do {
      if (((((int)uVar7 < 0) || (pVVar2->nSize <= (int)uVar7)) ||
          (uVar9 = pAig->nTruePis + iVar8, (int)uVar9 < 0)) || (pAig->vCis->nSize <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (fBackward == 0) {
        pvVar10 = pVVar2->pArray[uVar7];
      }
      else {
        pvVar10 = pAig->vCis->pArray[uVar9];
      }
      iVar1 = *(int *)((long)pvVar10 + 0x24);
      if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = vOrder->pArray[iVar1];
      if (((long)iVar1 < 0) || ((int)uVar4 <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar6[iVar1] = 0;
      iVar8 = iVar8 + 1;
      uVar7 = uVar7 + 1;
    } while (iVar8 < iVar13);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateVars2Q( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, int fBackward )
{
    Vec_Int_t * vVars2Q;
    Aig_Obj_t * pObjLi, * pObjLo;
    int i;
    vVars2Q = Vec_IntAlloc( 0 );
    Vec_IntFill( vVars2Q, Cudd_ReadSize(dd), 1 );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, fBackward ? pObjLo : pObjLi), 0 );
    return vVars2Q;
}